

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<8>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  BVH *bvh;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  size_t k;
  RayQueryContext *pRVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  char cVar28;
  int iVar29;
  AABBNodeMB4D *node1;
  ulong uVar30;
  undefined8 *puVar31;
  uint uVar32;
  undefined4 uVar33;
  uint uVar34;
  ulong uVar35;
  RayQueryContext *pRVar36;
  long lVar37;
  ulong *puVar38;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar46 [16];
  NodeRef root;
  undefined1 (*pauVar39) [32];
  bool bVar40;
  undefined1 auVar44 [32];
  undefined1 auVar41 [16];
  undefined1 auVar45 [32];
  undefined1 auVar47 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar48 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 extraout_var [56];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 in_ZMM5 [64];
  float fVar72;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  vfloat4 a0;
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  vbool<8> terminated;
  vbool<8> valid_o;
  TravRayK<8,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_2bc0 [32];
  undefined1 local_2b60 [32];
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2b20;
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [8];
  float fStack_2a78;
  float fStack_2a74;
  float fStack_2a70;
  float fStack_2a6c;
  float fStack_2a68;
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  float local_2a00;
  float fStack_29fc;
  float fStack_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  undefined4 uStack_29e4;
  float local_29e0;
  float fStack_29dc;
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined4 uStack_29c4;
  float local_29c0;
  float fStack_29bc;
  float fStack_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  undefined4 uStack_29a4;
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  float fStack_2804;
  undefined1 local_2800 [32];
  undefined4 local_27e0;
  undefined4 uStack_27dc;
  undefined4 uStack_27d8;
  undefined4 uStack_27d4;
  undefined4 uStack_27d0;
  undefined4 uStack_27cc;
  undefined4 uStack_27c8;
  undefined4 uStack_27c4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar53 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar45 = *(undefined1 (*) [32])(ray + 0x100);
    auVar73 = vpcmpeqd_avx2(auVar53,(undefined1  [32])valid_i->field_0);
    auVar53 = vcmpps_avx(auVar45,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar53 = vandps_avx(auVar53,auVar73);
    uVar32 = vmovmskps_avx(auVar53);
    if (uVar32 != 0) {
      auVar41 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
      local_2ac0 = *(undefined1 (*) [32])(ray + 0x80);
      local_2aa0 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_2a80 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar101._0_4_ = local_2a80._0_4_ * local_2a80._0_4_;
      auVar101._4_4_ = local_2a80._4_4_ * local_2a80._4_4_;
      auVar101._8_4_ = local_2a80._8_4_ * local_2a80._8_4_;
      auVar101._12_4_ = local_2a80._12_4_ * local_2a80._12_4_;
      auVar101._16_4_ = local_2a80._16_4_ * local_2a80._16_4_;
      auVar101._20_4_ = local_2a80._20_4_ * local_2a80._20_4_;
      auVar101._28_36_ = in_ZMM5._28_36_;
      auVar101._24_4_ = local_2a80._24_4_ * local_2a80._24_4_;
      auVar46 = vfmadd231ps_fma(auVar101._0_32_,local_2aa0,local_2aa0);
      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),local_2ac0,local_2ac0);
      auVar53 = vrsqrtps_avx(ZEXT1632(auVar46));
      uVar35 = (ulong)(uVar32 & 0xff);
      fVar72 = auVar53._0_4_;
      fVar77 = auVar53._4_4_;
      fVar78 = auVar53._8_4_;
      fVar79 = auVar53._12_4_;
      fVar80 = auVar53._16_4_;
      fVar81 = auVar53._20_4_;
      fVar82 = auVar53._24_4_;
      auVar73._4_4_ = fVar77 * fVar77 * fVar77 * auVar46._4_4_ * -0.5;
      auVar73._0_4_ = fVar72 * fVar72 * fVar72 * auVar46._0_4_ * -0.5;
      auVar73._8_4_ = fVar78 * fVar78 * fVar78 * auVar46._8_4_ * -0.5;
      auVar73._12_4_ = fVar79 * fVar79 * fVar79 * auVar46._12_4_ * -0.5;
      auVar73._16_4_ = fVar80 * fVar80 * fVar80 * -0.0;
      auVar73._20_4_ = fVar81 * fVar81 * fVar81 * -0.0;
      auVar73._24_4_ = fVar82 * fVar82 * fVar82 * -0.0;
      auVar73._28_4_ = 0;
      auVar83._8_4_ = 0x3fc00000;
      auVar83._0_8_ = 0x3fc000003fc00000;
      auVar83._12_4_ = 0x3fc00000;
      auVar83._16_4_ = 0x3fc00000;
      auVar83._20_4_ = 0x3fc00000;
      auVar83._24_4_ = 0x3fc00000;
      auVar83._28_4_ = 0x3fc00000;
      auVar46 = vfmadd213ps_fma(auVar83,auVar53,auVar73);
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar46);
      auVar67._8_4_ = 0x80000000;
      auVar67._0_8_ = 0x8000000080000000;
      auVar67._12_4_ = 0x80000000;
      auVar46._12_4_ = 0;
      auVar46._0_12_ = ZEXT812(0);
      auVar46 = auVar46 << 0x20;
      do {
        lVar37 = 0;
        for (uVar30 = uVar35; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          lVar37 = lVar37 + 1;
        }
        uVar30 = (ulong)(uint)((int)lVar37 * 4);
        auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar30 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar30 + 0xa0)),0x1c);
        auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + uVar30 + 0xc0)),0x28);
        fVar72 = *(float *)((long)&local_27c0 + uVar30);
        auVar89._0_4_ = auVar87._0_4_ * fVar72;
        auVar89._4_4_ = auVar87._4_4_ * fVar72;
        auVar89._8_4_ = auVar87._8_4_ * fVar72;
        auVar89._12_4_ = auVar87._12_4_ * fVar72;
        auVar96 = vshufpd_avx(auVar89,auVar89,1);
        auVar87 = vmovshdup_avx(auVar89);
        auVar94 = vunpckhps_avx(auVar89,auVar46);
        auVar93._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
        auVar93._8_8_ = auVar96._8_8_ ^ auVar67._8_8_;
        auVar93 = vinsertps_avx(auVar93,auVar89,0x2a);
        auVar94 = vshufps_avx(auVar94,ZEXT416(auVar87._0_4_ ^ 0x80000000),0x41);
        auVar87 = vdpps_avx(auVar93,auVar93,0x7f);
        auVar96 = vdpps_avx(auVar94,auVar94,0x7f);
        auVar87 = vcmpps_avx(auVar87,auVar96,1);
        auVar98._0_4_ = auVar87._0_4_;
        auVar98._4_4_ = auVar98._0_4_;
        auVar98._8_4_ = auVar98._0_4_;
        auVar98._12_4_ = auVar98._0_4_;
        auVar87 = vblendvps_avx(auVar93,auVar94,auVar98);
        auVar96 = vdpps_avx(auVar87,auVar87,0x7f);
        auVar93 = vrsqrtss_avx(auVar96,auVar96);
        fVar77 = auVar93._0_4_;
        fVar77 = fVar77 * 1.5 - auVar96._0_4_ * 0.5 * fVar77 * fVar77 * fVar77;
        auVar94._0_4_ = auVar87._0_4_ * fVar77;
        auVar94._4_4_ = auVar87._4_4_ * fVar77;
        auVar94._8_4_ = auVar87._8_4_ * fVar77;
        auVar94._12_4_ = auVar87._12_4_ * fVar77;
        auVar87 = vshufps_avx(auVar94,auVar94,0xc9);
        auVar96 = vshufps_avx(auVar89,auVar89,0xc9);
        auVar99._0_4_ = auVar94._0_4_ * auVar96._0_4_;
        auVar99._4_4_ = auVar94._4_4_ * auVar96._4_4_;
        auVar99._8_4_ = auVar94._8_4_ * auVar96._8_4_;
        auVar99._12_4_ = auVar94._12_4_ * auVar96._12_4_;
        auVar87 = vfmsub231ps_fma(auVar99,auVar89,auVar87);
        auVar93 = vshufps_avx(auVar87,auVar87,0xc9);
        auVar87 = vdpps_avx(auVar93,auVar93,0x7f);
        lVar37 = lVar37 * 0x30;
        auVar96 = vrsqrtss_avx(auVar87,auVar87);
        fVar77 = auVar96._0_4_;
        fVar77 = fVar77 * 1.5 - auVar87._0_4_ * 0.5 * fVar77 * fVar77 * fVar77;
        uVar35 = uVar35 - 1 & uVar35;
        auVar96._0_4_ = fVar77 * auVar93._0_4_;
        auVar96._4_4_ = fVar77 * auVar93._4_4_;
        auVar96._8_4_ = fVar77 * auVar93._8_4_;
        auVar96._12_4_ = fVar77 * auVar93._12_4_;
        auVar87._0_4_ = fVar72 * auVar89._0_4_;
        auVar87._4_4_ = fVar72 * auVar89._4_4_;
        auVar87._8_4_ = fVar72 * auVar89._8_4_;
        auVar87._12_4_ = fVar72 * auVar89._12_4_;
        auVar93 = vunpcklps_avx(auVar94,auVar87);
        auVar87 = vunpckhps_avx(auVar94,auVar87);
        auVar94 = vunpcklps_avx(auVar96,auVar46);
        auVar96 = vunpckhps_avx(auVar96,auVar46);
        auVar96 = vunpcklps_avx(auVar87,auVar96);
        auVar89 = vunpcklps_avx(auVar93,auVar94);
        auVar87 = vunpckhps_avx(auVar93,auVar94);
        *(undefined1 (*) [16])(local_27a0 + lVar37) = auVar89;
        *(undefined1 (*) [16])(auStack_2790 + lVar37) = auVar87;
        *(undefined1 (*) [16])(auStack_2780 + lVar37) = auVar96;
      } while (uVar35 != 0);
      local_2b20._0_4_ = *(undefined4 *)ray;
      local_2b20._4_4_ = *(undefined4 *)(ray + 4);
      local_2b20._8_4_ = *(undefined4 *)(ray + 8);
      local_2b20._12_4_ = *(undefined4 *)(ray + 0xc);
      local_2b20._16_4_ = *(undefined4 *)(ray + 0x10);
      local_2b20._20_4_ = *(undefined4 *)(ray + 0x14);
      local_2b20._24_4_ = *(undefined4 *)(ray + 0x18);
      local_2b20._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_2b20._32_4_ = *(undefined4 *)(ray + 0x20);
      local_2b20._36_4_ = *(undefined4 *)(ray + 0x24);
      local_2b20._40_4_ = *(undefined4 *)(ray + 0x28);
      local_2b20._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_2b20._48_4_ = *(undefined4 *)(ray + 0x30);
      local_2b20._52_4_ = *(undefined4 *)(ray + 0x34);
      local_2b20._56_4_ = *(undefined4 *)(ray + 0x38);
      local_2b20._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_2b20.field_0.z.field_0 = (vfloat_impl<8>)*(undefined1 (*) [32])(ray + 0x40);
      local_28c0._8_4_ = 0x7fffffff;
      local_28c0._0_8_ = 0x7fffffff7fffffff;
      local_28c0._12_4_ = 0x7fffffff;
      local_28c0._16_4_ = 0x7fffffff;
      local_28c0._20_4_ = 0x7fffffff;
      local_28c0._24_4_ = 0x7fffffff;
      local_28c0._28_4_ = 0x7fffffff;
      auVar53 = vandps_avx(local_28c0,local_2ac0);
      auVar90._8_4_ = 0x219392ef;
      auVar90._0_8_ = 0x219392ef219392ef;
      auVar90._12_4_ = 0x219392ef;
      auVar90._16_4_ = 0x219392ef;
      auVar90._20_4_ = 0x219392ef;
      auVar90._24_4_ = 0x219392ef;
      auVar90._28_4_ = 0x219392ef;
      auVar53 = vcmpps_avx(auVar53,auVar90,1);
      auVar73 = vblendvps_avx(local_2ac0,auVar90,auVar53);
      auVar53 = vandps_avx(local_28c0,local_2aa0);
      auVar53 = vcmpps_avx(auVar53,auVar90,1);
      auVar83 = vblendvps_avx(local_2aa0,auVar90,auVar53);
      auVar53 = vandps_avx(local_28c0,_local_2a80);
      auVar53 = vcmpps_avx(auVar53,auVar90,1);
      auVar51 = vrcpps_avx(auVar73);
      auVar53 = vblendvps_avx(_local_2a80,auVar90,auVar53);
      auVar91._8_4_ = 0x3f800000;
      auVar91._0_8_ = &DAT_3f8000003f800000;
      auVar91._12_4_ = 0x3f800000;
      auVar91._16_4_ = 0x3f800000;
      auVar91._20_4_ = 0x3f800000;
      auVar91._24_4_ = 0x3f800000;
      auVar91._28_4_ = 0x3f800000;
      auVar52 = vrcpps_avx(auVar83);
      auVar46 = vfnmadd213ps_fma(auVar73,auVar51,auVar91);
      auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar51,auVar51);
      auVar67 = vfnmadd213ps_fma(auVar83,auVar52,auVar91);
      auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar52,auVar52);
      auVar73 = vrcpps_avx(auVar53);
      auVar87 = vfnmadd213ps_fma(auVar53,auVar73,auVar91);
      auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar73,auVar73);
      local_2a60 = ZEXT1632(auVar46);
      local_2a40 = ZEXT1632(auVar67);
      local_2a20 = ZEXT1632(auVar87);
      local_2a00 = auVar46._0_4_ * (float)local_2b20._0_4_;
      fStack_29fc = auVar46._4_4_ * (float)local_2b20._4_4_;
      fStack_29f8 = auVar46._8_4_ * (float)local_2b20._8_4_;
      fStack_29f4 = auVar46._12_4_ * (float)local_2b20._12_4_;
      fStack_29f0 = (float)local_2b20._16_4_ * 0.0;
      fStack_29ec = (float)local_2b20._20_4_ * 0.0;
      uStack_29e4 = auVar73._28_4_;
      fStack_29e8 = (float)local_2b20._24_4_ * 0.0;
      local_29e0 = (float)local_2b20._32_4_ * auVar67._0_4_;
      fStack_29dc = (float)local_2b20._36_4_ * auVar67._4_4_;
      fStack_29d8 = (float)local_2b20._40_4_ * auVar67._8_4_;
      fStack_29d4 = (float)local_2b20._44_4_ * auVar67._12_4_;
      fStack_29d0 = (float)local_2b20._48_4_ * 0.0;
      fStack_29cc = (float)local_2b20._52_4_ * 0.0;
      fStack_29c8 = (float)local_2b20._56_4_ * 0.0;
      local_29c0 = local_2b20._64_4_ * auVar87._0_4_;
      fStack_29bc = local_2b20._68_4_ * auVar87._4_4_;
      fStack_29b8 = local_2b20._72_4_ * auVar87._8_4_;
      fStack_29b4 = local_2b20._76_4_ * auVar87._12_4_;
      fStack_29b0 = local_2b20._80_4_ * 0.0;
      fStack_29ac = local_2b20._84_4_ * 0.0;
      fStack_29a8 = local_2b20._88_4_ * 0.0;
      auVar73 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar53 = vcmpps_avx(local_2a60,auVar73,1);
      auVar68._8_4_ = 0x10;
      auVar68._0_8_ = 0x1000000010;
      auVar68._12_4_ = 0x10;
      auVar68._16_4_ = 0x10;
      auVar68._20_4_ = 0x10;
      auVar68._24_4_ = 0x10;
      auVar68._28_4_ = 0x10;
      local_29a0 = vandps_avx(auVar53,auVar68);
      auVar51._8_4_ = 0x20;
      auVar51._0_8_ = 0x2000000020;
      auVar51._12_4_ = 0x20;
      auVar51._16_4_ = 0x20;
      auVar51._20_4_ = 0x20;
      auVar51._24_4_ = 0x20;
      auVar51._28_4_ = 0x20;
      auVar69._8_4_ = 0x30;
      auVar69._0_8_ = 0x3000000030;
      auVar69._12_4_ = 0x30;
      auVar69._16_4_ = 0x30;
      auVar69._20_4_ = 0x30;
      auVar69._24_4_ = 0x30;
      auVar69._28_4_ = 0x30;
      auVar53 = vcmpps_avx(ZEXT1632(auVar67),auVar73,5);
      local_2980 = vblendvps_avx(auVar69,auVar51,auVar53);
      auVar52._8_4_ = 0x40;
      auVar52._0_8_ = 0x4000000040;
      auVar52._12_4_ = 0x40;
      auVar52._16_4_ = 0x40;
      auVar52._20_4_ = 0x40;
      auVar52._24_4_ = 0x40;
      auVar52._28_4_ = 0x40;
      auVar62._8_4_ = 0x50;
      auVar62._0_8_ = 0x5000000050;
      auVar62._12_4_ = 0x50;
      auVar62._16_4_ = 0x50;
      auVar62._20_4_ = 0x50;
      auVar62._24_4_ = 0x50;
      auVar62._28_4_ = 0x50;
      auVar73 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar53 = vcmpps_avx(ZEXT1632(auVar87),auVar73,5);
      local_2960 = vblendvps_avx(auVar62,auVar52,auVar53);
      auVar53 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar73);
      auVar45 = vmaxps_avx(auVar45,auVar73);
      local_28e0 = vpmovsxwd_avx2(auVar41);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar101 = ZEXT3264(local_1e80);
      local_2940 = vblendvps_avx(local_1e80,auVar53,local_28e0);
      auVar53._8_4_ = 0xff800000;
      auVar53._0_8_ = 0xff800000ff800000;
      auVar53._12_4_ = 0xff800000;
      auVar53._16_4_ = 0xff800000;
      auVar53._20_4_ = 0xff800000;
      auVar53._24_4_ = 0xff800000;
      auVar53._28_4_ = 0xff800000;
      local_2920 = vblendvps_avx(auVar53,auVar45,local_28e0);
      auVar46 = vpcmpeqd_avx(local_2920._0_16_,local_2920._0_16_);
      local_2b60 = vpmovsxwd_avx2(auVar41 ^ auVar46);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 5;
      }
      else {
        uVar32 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      pRVar36 = (RayQueryContext *)0x0;
      puVar38 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar39 = (undefined1 (*) [32])local_1e40;
      local_2608 = (bvh->root).ptr;
      local_2900._16_16_ = mm_lookupmask_ps._0_16_;
      local_2900._0_16_ = mm_lookupmask_ps._0_16_;
      auVar49 = ZEXT3264(local_2900);
      local_1e60 = local_2940;
      uStack_29c4 = local_2b20._28_4_;
      uStack_29a4 = local_2b20._60_4_;
      do {
        pauVar39 = pauVar39 + -1;
        root.ptr = puVar38[-1];
        puVar38 = puVar38 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_005be5cc:
          iVar29 = 3;
        }
        else {
          auVar45 = *pauVar39;
          auVar53 = vcmpps_avx(auVar45,local_2920,1);
          if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar53 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar53 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar53 >> 0x7f,0) == '\0') &&
                (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar53 >> 0xbf,0) == '\0') &&
              (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar53[0x1f]) {
            iVar29 = 2;
          }
          else {
            uVar33 = vmovmskps_avx(auVar53);
            pRVar36 = (RayQueryContext *)CONCAT44((int)((ulong)pRVar36 >> 0x20),uVar33);
            iVar29 = 0;
            if ((uint)POPCOUNT(uVar33) <= uVar32) {
              for (; pRVar36 != (RayQueryContext *)0x0;
                  pRVar36 = (RayQueryContext *)
                            ((ulong)((long)&pRVar36[-1].args + 7U) & (ulong)pRVar36)) {
                k = 0;
                for (pRVar11 = pRVar36; ((ulong)pRVar11 & 1) == 0;
                    pRVar11 = (RayQueryContext *)((ulong)pRVar11 >> 1 | 0x8000000000000000)) {
                  k = k + 1;
                }
                auVar49 = ZEXT1664(auVar49._0_16_);
                bVar40 = occluded1(This,bvh,root,k,(Precalculations *)&local_27c0,ray,
                                   (TravRayK<8,_false> *)&local_2b20.field_0,context);
                if (bVar40) {
                  *(undefined4 *)(local_2b60 + k * 4) = 0xffffffff;
                }
                auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              }
              auVar53 = _DAT_0205a980 & ~local_2b60;
              iVar29 = 3;
              pRVar36 = (RayQueryContext *)0x0;
              if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar53 >> 0x7f,0) != '\0') ||
                    (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar53 >> 0xbf,0) != '\0') ||
                  (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar53[0x1f] < '\0') {
                auVar49 = ZEXT3264(local_2920);
                auVar59._8_4_ = 0xff800000;
                auVar59._0_8_ = 0xff800000ff800000;
                auVar59._12_4_ = 0xff800000;
                auVar59._16_4_ = 0xff800000;
                auVar59._20_4_ = 0xff800000;
                auVar59._24_4_ = 0xff800000;
                auVar59._28_4_ = 0xff800000;
                local_2920 = vblendvps_avx(local_2920,auVar59,local_2b60);
                iVar29 = 2;
              }
            }
            auVar53 = local_2b60;
            auVar103 = ZEXT3264(auVar45);
            if (uVar32 < (uint)POPCOUNT(uVar33)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar45 = vcmpps_avx(local_2920,auVar103._0_32_,6);
                    if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar45 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar45 >> 0x7f,0) == '\0') &&
                          (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar45 >> 0xbf,0) == '\0') &&
                        (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar45[0x1f]) {
                      iVar29 = 2;
                    }
                    else {
                      auVar49 = ZEXT3264(local_2b60);
                      pRVar36 = (RayQueryContext *)This->leafIntersector;
                      local_2b40 = local_2900._0_8_;
                      uStack_2b38 = local_2900._8_8_;
                      uStack_2b30 = local_2900._16_8_;
                      uStack_2b28 = local_2900._24_8_;
                      uVar34 = vmovmskps_avx(local_2b60);
                      if ((uVar34 ^ 0xff) != 0) {
                        uVar35 = (ulong)(byte)(uVar34 ^ 0xff);
                        puVar31 = (undefined8 *)
                                  ((long)pRVar36 +
                                  (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 0x40 + 0x28);
                        do {
                          lVar37 = 0;
                          for (uVar30 = uVar35; (uVar30 & 1) == 0;
                              uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                            lVar37 = lVar37 + 1;
                          }
                          pRVar36 = context;
                          cVar28 = (*(code *)*puVar31)(&local_27c0,ray,lVar37,context,
                                                       (byte *)(root.ptr & 0xfffffffffffffff0));
                          auVar49._8_56_ = extraout_var;
                          auVar49._0_8_ = extraout_XMM1_Qa;
                          if (cVar28 != '\0') {
                            *(undefined4 *)((long)&local_2b40 + lVar37 * 4) = 0xffffffff;
                          }
                          uVar35 = uVar35 - 1 & uVar35;
                        } while (uVar35 != 0);
                      }
                      auVar45._8_8_ = uStack_2b38;
                      auVar45._0_8_ = local_2b40;
                      auVar45._16_8_ = uStack_2b30;
                      auVar45._24_8_ = uStack_2b28;
                      local_2b60 = vorps_avx(auVar53,auVar45);
                      auVar45 = _DAT_0205a980 & ~local_2b60;
                      if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar45 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar45 >> 0x7f,0) == '\0') &&
                            (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar45 >> 0xbf,0) == '\0') &&
                          (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar45[0x1f]) {
                        iVar29 = 3;
                      }
                      else {
                        auVar49 = ZEXT3264(local_2920);
                        auVar58._8_4_ = 0xff800000;
                        auVar58._0_8_ = 0xff800000ff800000;
                        auVar58._12_4_ = 0xff800000;
                        auVar58._16_4_ = 0xff800000;
                        auVar58._20_4_ = 0xff800000;
                        auVar58._24_4_ = 0xff800000;
                        auVar58._28_4_ = 0xff800000;
                        local_2920 = vblendvps_avx(local_2920,auVar58,local_2b60);
                        iVar29 = 0;
                      }
                    }
                    auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                                  CONCAT424(0x7f800000,
                                                            CONCAT420(0x7f800000,
                                                                      CONCAT416(0x7f800000,
                                                                                CONCAT412(0x7f800000
                                                                                          ,CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    break;
                  }
                  goto LAB_005be5cc;
                }
                uVar30 = root.ptr & 0xfffffffffffffff0;
                uVar34 = (uint)root.ptr & 7;
                local_28a0 = vcmpps_avx(local_2920,auVar103._0_32_,6);
                auVar103 = ZEXT3264(auVar101._0_32_);
                uVar35 = 0;
                root.ptr = 8;
                do {
                  uVar4 = *(ulong *)(uVar30 + uVar35 * 8);
                  if (uVar4 != 8) {
                    if ((uVar34 == 6) || (uVar34 == 1)) {
                      uVar33 = *(undefined4 *)(uVar30 + 0x80 + uVar35 * 4);
                      auVar42._4_4_ = uVar33;
                      auVar42._0_4_ = uVar33;
                      auVar42._8_4_ = uVar33;
                      auVar42._12_4_ = uVar33;
                      auVar42._16_4_ = uVar33;
                      auVar42._20_4_ = uVar33;
                      auVar42._24_4_ = uVar33;
                      auVar42._28_4_ = uVar33;
                      uVar33 = *(undefined4 *)(uVar30 + 0x20 + uVar35 * 4);
                      auVar60._4_4_ = uVar33;
                      auVar60._0_4_ = uVar33;
                      auVar60._8_4_ = uVar33;
                      auVar60._12_4_ = uVar33;
                      auVar60._16_4_ = uVar33;
                      auVar60._20_4_ = uVar33;
                      auVar60._24_4_ = uVar33;
                      auVar60._28_4_ = uVar33;
                      auVar45 = *(undefined1 (*) [32])(ray + 0xe0);
                      uVar33 = *(undefined4 *)(uVar30 + 0xa0 + uVar35 * 4);
                      auVar54._4_4_ = uVar33;
                      auVar54._0_4_ = uVar33;
                      auVar54._8_4_ = uVar33;
                      auVar54._12_4_ = uVar33;
                      auVar54._16_4_ = uVar33;
                      auVar54._20_4_ = uVar33;
                      auVar54._24_4_ = uVar33;
                      auVar54._28_4_ = uVar33;
                      auVar41 = vfmadd231ps_fma(auVar60,auVar45,auVar42);
                      uVar33 = *(undefined4 *)(uVar30 + 0x40 + uVar35 * 4);
                      auVar43._4_4_ = uVar33;
                      auVar43._0_4_ = uVar33;
                      auVar43._8_4_ = uVar33;
                      auVar43._12_4_ = uVar33;
                      auVar43._16_4_ = uVar33;
                      auVar43._20_4_ = uVar33;
                      auVar43._24_4_ = uVar33;
                      auVar43._28_4_ = uVar33;
                      auVar46 = vfmadd231ps_fma(auVar43,auVar45,auVar54);
                      uVar33 = *(undefined4 *)(uVar30 + 0xc0 + uVar35 * 4);
                      auVar55._4_4_ = uVar33;
                      auVar55._0_4_ = uVar33;
                      auVar55._8_4_ = uVar33;
                      auVar55._12_4_ = uVar33;
                      auVar55._16_4_ = uVar33;
                      auVar55._20_4_ = uVar33;
                      auVar55._24_4_ = uVar33;
                      auVar55._28_4_ = uVar33;
                      uVar33 = *(undefined4 *)(uVar30 + 0x60 + uVar35 * 4);
                      auVar63._4_4_ = uVar33;
                      auVar63._0_4_ = uVar33;
                      auVar63._8_4_ = uVar33;
                      auVar63._12_4_ = uVar33;
                      auVar63._16_4_ = uVar33;
                      auVar63._20_4_ = uVar33;
                      auVar63._24_4_ = uVar33;
                      auVar63._28_4_ = uVar33;
                      uVar33 = *(undefined4 *)(uVar30 + 0x90 + uVar35 * 4);
                      auVar74._4_4_ = uVar33;
                      auVar74._0_4_ = uVar33;
                      auVar74._8_4_ = uVar33;
                      auVar74._12_4_ = uVar33;
                      auVar74._16_4_ = uVar33;
                      auVar74._20_4_ = uVar33;
                      auVar74._24_4_ = uVar33;
                      auVar74._28_4_ = uVar33;
                      uVar33 = *(undefined4 *)(uVar30 + 0x30 + uVar35 * 4);
                      auVar70._4_4_ = uVar33;
                      auVar70._0_4_ = uVar33;
                      auVar70._8_4_ = uVar33;
                      auVar70._12_4_ = uVar33;
                      auVar70._16_4_ = uVar33;
                      auVar70._20_4_ = uVar33;
                      auVar70._24_4_ = uVar33;
                      auVar70._28_4_ = uVar33;
                      auVar67 = vfmadd231ps_fma(auVar63,auVar45,auVar55);
                      auVar87 = vfmadd231ps_fma(auVar70,auVar45,auVar74);
                      uVar33 = *(undefined4 *)(uVar30 + 0xb0 + uVar35 * 4);
                      auVar56._4_4_ = uVar33;
                      auVar56._0_4_ = uVar33;
                      auVar56._8_4_ = uVar33;
                      auVar56._12_4_ = uVar33;
                      auVar56._16_4_ = uVar33;
                      auVar56._20_4_ = uVar33;
                      auVar56._24_4_ = uVar33;
                      auVar56._28_4_ = uVar33;
                      uVar33 = *(undefined4 *)(uVar30 + 0x50 + uVar35 * 4);
                      auVar75._4_4_ = uVar33;
                      auVar75._0_4_ = uVar33;
                      auVar75._8_4_ = uVar33;
                      auVar75._12_4_ = uVar33;
                      auVar75._16_4_ = uVar33;
                      auVar75._20_4_ = uVar33;
                      auVar75._24_4_ = uVar33;
                      auVar75._28_4_ = uVar33;
                      uVar33 = *(undefined4 *)(uVar30 + 0xd0 + uVar35 * 4);
                      auVar84._4_4_ = uVar33;
                      auVar84._0_4_ = uVar33;
                      auVar84._8_4_ = uVar33;
                      auVar84._12_4_ = uVar33;
                      auVar84._16_4_ = uVar33;
                      auVar84._20_4_ = uVar33;
                      auVar84._24_4_ = uVar33;
                      auVar84._28_4_ = uVar33;
                      auVar96 = vfmadd231ps_fma(auVar75,auVar45,auVar56);
                      uVar33 = *(undefined4 *)(uVar30 + 0x70 + uVar35 * 4);
                      auVar85._4_4_ = uVar33;
                      auVar85._0_4_ = uVar33;
                      auVar85._8_4_ = uVar33;
                      auVar85._12_4_ = uVar33;
                      auVar85._16_4_ = uVar33;
                      auVar85._20_4_ = uVar33;
                      auVar85._24_4_ = uVar33;
                      auVar85._28_4_ = uVar33;
                      auVar93 = vfmadd231ps_fma(auVar85,auVar45,auVar84);
                      auVar23._4_4_ = fStack_29fc;
                      auVar23._0_4_ = local_2a00;
                      auVar23._8_4_ = fStack_29f8;
                      auVar23._12_4_ = fStack_29f4;
                      auVar23._16_4_ = fStack_29f0;
                      auVar23._20_4_ = fStack_29ec;
                      auVar23._24_4_ = fStack_29e8;
                      auVar23._28_4_ = uStack_29e4;
                      auVar41 = vfmsub213ps_fma(ZEXT1632(auVar41),local_2a60,auVar23);
                      auVar24._4_4_ = fStack_29dc;
                      auVar24._0_4_ = local_29e0;
                      auVar24._8_4_ = fStack_29d8;
                      auVar24._12_4_ = fStack_29d4;
                      auVar24._16_4_ = fStack_29d0;
                      auVar24._20_4_ = fStack_29cc;
                      auVar24._24_4_ = fStack_29c8;
                      auVar24._28_4_ = uStack_29c4;
                      auVar46 = vfmsub213ps_fma(ZEXT1632(auVar46),local_2a40,auVar24);
                      auVar25._4_4_ = fStack_29bc;
                      auVar25._0_4_ = local_29c0;
                      auVar25._8_4_ = fStack_29b8;
                      auVar25._12_4_ = fStack_29b4;
                      auVar25._16_4_ = fStack_29b0;
                      auVar25._20_4_ = fStack_29ac;
                      auVar25._24_4_ = fStack_29a8;
                      auVar25._28_4_ = uStack_29a4;
                      auVar67 = vfmsub213ps_fma(ZEXT1632(auVar67),local_2a20,auVar25);
                      auVar87 = vfmsub213ps_fma(ZEXT1632(auVar87),local_2a60,auVar23);
                      auVar96 = vfmsub213ps_fma(ZEXT1632(auVar96),local_2a40,auVar24);
                      auVar93 = vfmsub213ps_fma(ZEXT1632(auVar93),local_2a20,auVar25);
                      auVar73 = vpminsd_avx2(ZEXT1632(auVar41),ZEXT1632(auVar87));
                      auVar83 = vpminsd_avx2(ZEXT1632(auVar46),ZEXT1632(auVar96));
                      auVar73 = vpmaxsd_avx2(auVar73,auVar83);
                      auVar83 = vpminsd_avx2(ZEXT1632(auVar67),ZEXT1632(auVar93));
                      auVar83 = vpmaxsd_avx2(auVar73,auVar83);
                      auVar73 = vpmaxsd_avx2(ZEXT1632(auVar41),ZEXT1632(auVar87));
                      auVar51 = vpmaxsd_avx2(ZEXT1632(auVar46),ZEXT1632(auVar96));
                      auVar51 = vpminsd_avx2(auVar73,auVar51);
                      auVar73 = vpmaxsd_avx2(ZEXT1632(auVar67),ZEXT1632(auVar93));
                      auVar51 = vpminsd_avx2(auVar51,auVar73);
                      auVar73 = vpmaxsd_avx2(auVar83,local_2940);
                      auVar51 = vpminsd_avx2(auVar51,local_2920);
                      auVar73 = vcmpps_avx(auVar73,auVar51,2);
                      if (uVar34 != 6) goto LAB_005be3dc;
                      uVar33 = *(undefined4 *)(uVar30 + 0xe0 + uVar35 * 4);
                      auVar61._4_4_ = uVar33;
                      auVar61._0_4_ = uVar33;
                      auVar61._8_4_ = uVar33;
                      auVar61._12_4_ = uVar33;
                      auVar61._16_4_ = uVar33;
                      auVar61._20_4_ = uVar33;
                      auVar61._24_4_ = uVar33;
                      auVar61._28_4_ = uVar33;
                      auVar51 = vcmpps_avx(auVar61,auVar45,2);
                      uVar33 = *(undefined4 *)(uVar30 + 0xf0 + uVar35 * 4);
                      auVar64._4_4_ = uVar33;
                      auVar64._0_4_ = uVar33;
                      auVar64._8_4_ = uVar33;
                      auVar64._12_4_ = uVar33;
                      auVar64._16_4_ = uVar33;
                      auVar64._20_4_ = uVar33;
                      auVar64._24_4_ = uVar33;
                      auVar64._28_4_ = uVar33;
                      auVar45 = vcmpps_avx(auVar45,auVar64,1);
                      auVar45 = vandps_avx(auVar51,auVar45);
                      auVar45 = vandps_avx(auVar45,auVar73);
                      auVar41 = auVar45._0_16_;
                      auVar46 = auVar45._16_16_;
                    }
                    else {
                      local_2bc0._4_4_ = *(undefined4 *)(uVar30 + 0x20 + uVar35 * 4);
                      local_2bc0._0_4_ = local_2bc0._4_4_;
                      local_2bc0._8_4_ = local_2bc0._4_4_;
                      local_2bc0._12_4_ = local_2bc0._4_4_;
                      local_2bc0._16_4_ = local_2bc0._4_4_;
                      local_2bc0._20_4_ = local_2bc0._4_4_;
                      local_2bc0._24_4_ = local_2bc0._4_4_;
                      local_2bc0._28_4_ = local_2bc0._4_4_;
                      uVar33 = *(undefined4 *)(uVar30 + 0x30 + uVar35 * 4);
                      local_27e0 = *(undefined4 *)(uVar30 + 0x40 + uVar35 * 4);
                      uVar1 = *(undefined4 *)(uVar30 + 0x50 + uVar35 * 4);
                      auVar88._4_4_ = uVar1;
                      auVar88._0_4_ = uVar1;
                      auVar88._8_4_ = uVar1;
                      auVar88._12_4_ = uVar1;
                      auVar88._16_4_ = uVar1;
                      auVar88._20_4_ = uVar1;
                      auVar88._24_4_ = uVar1;
                      auVar88._28_4_ = uVar1;
                      uVar2 = *(undefined4 *)(uVar30 + 0x60 + uVar35 * 4);
                      auVar86._4_4_ = uVar2;
                      auVar86._0_4_ = uVar2;
                      auVar86._8_4_ = uVar2;
                      auVar86._12_4_ = uVar2;
                      auVar86._16_4_ = uVar2;
                      auVar86._20_4_ = uVar2;
                      auVar86._24_4_ = uVar2;
                      auVar86._28_4_ = uVar2;
                      uVar2 = *(undefined4 *)(uVar30 + 0x70 + uVar35 * 4);
                      auVar71._4_4_ = uVar2;
                      auVar71._0_4_ = uVar2;
                      auVar71._8_4_ = uVar2;
                      auVar71._12_4_ = uVar2;
                      auVar71._16_4_ = uVar2;
                      auVar71._20_4_ = uVar2;
                      auVar71._24_4_ = uVar2;
                      auVar71._28_4_ = uVar2;
                      fVar72 = *(float *)(uVar30 + 0x80 + uVar35 * 4);
                      auVar100._4_4_ = fVar72;
                      auVar100._0_4_ = fVar72;
                      auVar100._8_4_ = fVar72;
                      auVar100._12_4_ = fVar72;
                      auVar100._16_4_ = fVar72;
                      auVar100._20_4_ = fVar72;
                      auVar100._24_4_ = fVar72;
                      auVar100._28_4_ = fVar72;
                      fVar77 = *(float *)(uVar30 + 0x90 + uVar35 * 4);
                      auVar102._4_4_ = fVar77;
                      auVar102._0_4_ = fVar77;
                      auVar102._8_4_ = fVar77;
                      auVar102._12_4_ = fVar77;
                      auVar102._16_4_ = fVar77;
                      auVar102._20_4_ = fVar77;
                      auVar102._24_4_ = fVar77;
                      auVar102._28_4_ = fVar77;
                      fVar78 = *(float *)(uVar30 + 0xa0 + uVar35 * 4);
                      auVar104._4_4_ = fVar78;
                      auVar104._0_4_ = fVar78;
                      auVar104._8_4_ = fVar78;
                      auVar104._12_4_ = fVar78;
                      auVar104._16_4_ = fVar78;
                      auVar104._20_4_ = fVar78;
                      auVar104._24_4_ = fVar78;
                      auVar104._28_4_ = fVar78;
                      uVar3 = *(undefined4 *)(uVar30 + 0xb0 + uVar35 * 4);
                      auVar76._4_4_ = uVar3;
                      auVar76._0_4_ = uVar3;
                      auVar76._8_4_ = uVar3;
                      auVar76._12_4_ = uVar3;
                      auVar76._16_4_ = uVar3;
                      auVar76._20_4_ = uVar3;
                      auVar76._24_4_ = uVar3;
                      auVar76._28_4_ = uVar3;
                      uVar3 = *(undefined4 *)(uVar30 + 0xc0 + uVar35 * 4);
                      auVar57._4_4_ = uVar3;
                      auVar57._0_4_ = uVar3;
                      auVar57._8_4_ = uVar3;
                      auVar57._12_4_ = uVar3;
                      auVar57._16_4_ = uVar3;
                      auVar57._20_4_ = uVar3;
                      auVar57._24_4_ = uVar3;
                      auVar57._28_4_ = uVar3;
                      uVar3 = *(undefined4 *)(uVar30 + 0xd0 + uVar35 * 4);
                      auVar65._4_4_ = uVar3;
                      auVar65._0_4_ = uVar3;
                      auVar65._8_4_ = uVar3;
                      auVar65._12_4_ = uVar3;
                      auVar65._16_4_ = uVar3;
                      auVar65._20_4_ = uVar3;
                      auVar65._24_4_ = uVar3;
                      auVar65._28_4_ = uVar3;
                      fVar79 = *(float *)(uVar30 + 0xe0 + uVar35 * 4);
                      fVar80 = *(float *)(uVar30 + 0xf0 + uVar35 * 4);
                      fVar81 = *(float *)(uVar30 + 0x100 + uVar35 * 4);
                      auVar41 = vfmadd231ps_fma(auVar76,(undefined1  [32])
                                                        local_2b20.field_0.z.field_0,auVar100);
                      auVar46 = vfmadd231ps_fma(auVar57,(undefined1  [32])
                                                        local_2b20.field_0.z.field_0,auVar102);
                      auVar67 = vfmadd231ps_fma(auVar65,(undefined1  [32])
                                                        local_2b20.field_0.z.field_0,auVar104);
                      auVar50._0_4_ = fVar72 * (float)local_2a80._0_4_;
                      auVar50._4_4_ = fVar72 * (float)local_2a80._4_4_;
                      auVar50._8_4_ = fVar72 * fStack_2a78;
                      auVar50._12_4_ = fVar72 * fStack_2a74;
                      auVar50._16_4_ = fVar72 * fStack_2a70;
                      auVar50._20_4_ = fVar72 * fStack_2a6c;
                      auVar50._28_36_ = auVar49._28_36_;
                      auVar50._24_4_ = fVar72 * fStack_2a68;
                      auVar12._4_4_ = fVar77 * (float)local_2a80._4_4_;
                      auVar12._0_4_ = fVar77 * (float)local_2a80._0_4_;
                      auVar12._8_4_ = fVar77 * fStack_2a78;
                      auVar12._12_4_ = fVar77 * fStack_2a74;
                      auVar12._16_4_ = fVar77 * fStack_2a70;
                      auVar12._20_4_ = fVar77 * fStack_2a6c;
                      auVar12._24_4_ = fVar77 * fStack_2a68;
                      auVar12._28_4_ = fVar77;
                      auVar13._4_4_ = fVar78 * (float)local_2a80._4_4_;
                      auVar13._0_4_ = fVar78 * (float)local_2a80._0_4_;
                      auVar13._8_4_ = fVar78 * fStack_2a78;
                      auVar13._12_4_ = fVar78 * fStack_2a74;
                      auVar13._16_4_ = fVar78 * fStack_2a70;
                      auVar13._20_4_ = fVar78 * fStack_2a6c;
                      auVar13._24_4_ = fVar78 * fStack_2a68;
                      auVar13._28_4_ = fVar72;
                      auVar87 = vfmadd231ps_fma(auVar50._0_32_,local_2aa0,auVar88);
                      auVar96 = vfmadd231ps_fma(auVar12,local_2aa0,auVar86);
                      auVar93 = vfmadd231ps_fma(auVar13,auVar71,local_2aa0);
                      auVar22._4_4_ = local_2b20._36_4_;
                      auVar22._0_4_ = local_2b20._32_4_;
                      auVar22._8_4_ = local_2b20._40_4_;
                      auVar22._12_4_ = local_2b20._44_4_;
                      auVar22._16_4_ = local_2b20._48_4_;
                      auVar22._20_4_ = local_2b20._52_4_;
                      auVar22._24_4_ = local_2b20._56_4_;
                      auVar22._28_4_ = local_2b20._60_4_;
                      auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar22,auVar88);
                      fVar72 = *(float *)(uVar30 + 0x110 + uVar35 * 4);
                      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar22,auVar86);
                      local_2860 = ZEXT1632(auVar46);
                      fVar77 = *(float *)(uVar30 + 0x120 + uVar35 * 4);
                      fVar78 = *(float *)(uVar30 + 0x130 + uVar35 * 4);
                      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar22,auVar71);
                      local_2880 = ZEXT1632(auVar46);
                      auVar45 = *(undefined1 (*) [32])(ray + 0xe0);
                      fVar82 = auVar45._0_4_;
                      fVar5 = auVar45._4_4_;
                      auVar14._4_4_ = fVar79 * fVar5;
                      auVar14._0_4_ = fVar79 * fVar82;
                      fVar6 = auVar45._8_4_;
                      auVar14._8_4_ = fVar79 * fVar6;
                      fVar7 = auVar45._12_4_;
                      auVar14._12_4_ = fVar79 * fVar7;
                      fVar8 = auVar45._16_4_;
                      auVar14._16_4_ = fVar79 * fVar8;
                      fVar9 = auVar45._20_4_;
                      auVar14._20_4_ = fVar79 * fVar9;
                      fVar10 = auVar45._24_4_;
                      auVar14._24_4_ = fVar79 * fVar10;
                      auVar14._28_4_ = uVar1;
                      auVar15._4_4_ = fVar80 * fVar5;
                      auVar15._0_4_ = fVar80 * fVar82;
                      auVar15._8_4_ = fVar80 * fVar6;
                      auVar15._12_4_ = fVar80 * fVar7;
                      auVar15._16_4_ = fVar80 * fVar8;
                      auVar15._20_4_ = fVar80 * fVar9;
                      auVar15._24_4_ = fVar80 * fVar10;
                      auVar15._28_4_ = uVar2;
                      auVar66._0_4_ = fVar81 * fVar82;
                      auVar66._4_4_ = fVar81 * fVar5;
                      auVar66._8_4_ = fVar81 * fVar6;
                      auVar66._12_4_ = fVar81 * fVar7;
                      auVar66._16_4_ = fVar81 * fVar8;
                      auVar66._20_4_ = fVar81 * fVar9;
                      auVar66._24_4_ = fVar81 * fVar10;
                      auVar66._28_4_ = 0;
                      auVar95._8_4_ = 0x3f800000;
                      auVar95._0_8_ = &DAT_3f8000003f800000;
                      auVar95._12_4_ = 0x3f800000;
                      auVar95._16_4_ = 0x3f800000;
                      auVar95._20_4_ = 0x3f800000;
                      auVar95._24_4_ = 0x3f800000;
                      auVar95._28_4_ = 0x3f800000;
                      auVar45 = vsubps_avx(auVar95,auVar45);
                      auVar73 = ZEXT1232(ZEXT412(0)) << 0x20;
                      auVar94 = vfmadd231ps_fma(auVar14,auVar45,auVar73);
                      auVar46 = vfmadd231ps_fma(auVar15,auVar45,auVar73);
                      local_2840 = ZEXT1632(auVar46);
                      auVar46 = vfmadd231ps_fma(auVar66,auVar45,ZEXT1232(ZEXT412(0)) << 0x20);
                      local_2800 = ZEXT1632(auVar46);
                      local_2820 = auVar45._0_4_;
                      auVar92._0_4_ = fVar72 * fVar82 + local_2820;
                      fStack_281c = auVar45._4_4_;
                      auVar92._4_4_ = fVar72 * fVar5 + fStack_281c;
                      fStack_2818 = auVar45._8_4_;
                      auVar92._8_4_ = fVar72 * fVar6 + fStack_2818;
                      fStack_2814 = auVar45._12_4_;
                      auVar92._12_4_ = fVar72 * fVar7 + fStack_2814;
                      fStack_2810 = auVar45._16_4_;
                      auVar92._16_4_ = fVar72 * fVar8 + fStack_2810;
                      fStack_280c = auVar45._20_4_;
                      auVar92._20_4_ = fVar72 * fVar9 + fStack_280c;
                      fStack_2808 = auVar45._24_4_;
                      auVar92._24_4_ = fVar72 * fVar10 + fStack_2808;
                      fStack_2804 = auVar45._28_4_;
                      auVar92._28_4_ = fVar79 + fStack_2804;
                      auVar97._0_4_ = local_2820 + fVar82 * fVar77;
                      auVar97._4_4_ = fStack_281c + fVar5 * fVar77;
                      auVar97._8_4_ = fStack_2818 + fVar6 * fVar77;
                      auVar97._12_4_ = fStack_2814 + fVar7 * fVar77;
                      auVar97._16_4_ = fStack_2810 + fVar8 * fVar77;
                      auVar97._20_4_ = fStack_280c + fVar9 * fVar77;
                      auVar97._24_4_ = fStack_2808 + fVar10 * fVar77;
                      auVar97._28_4_ = fStack_2804 + fVar77;
                      local_2820 = local_2820 + fVar82 * fVar78;
                      fStack_281c = fStack_281c + fVar5 * fVar78;
                      fStack_2818 = fStack_2818 + fVar6 * fVar78;
                      fStack_2814 = fStack_2814 + fVar7 * fVar78;
                      fStack_2810 = fStack_2810 + fVar8 * fVar78;
                      fStack_280c = fStack_280c + fVar9 * fVar78;
                      fStack_2808 = fStack_2808 + fVar10 * fVar78;
                      fStack_2804 = fStack_2804 + fVar78;
                      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar87),local_2ac0,local_2bc0);
                      auVar20._4_4_ = uVar33;
                      auVar20._0_4_ = uVar33;
                      auVar20._8_4_ = uVar33;
                      auVar20._12_4_ = uVar33;
                      auVar20._16_4_ = uVar33;
                      auVar20._20_4_ = uVar33;
                      auVar20._24_4_ = uVar33;
                      auVar20._28_4_ = uVar33;
                      auVar67 = vfmadd231ps_fma(ZEXT1632(auVar96),local_2ac0,auVar20);
                      auVar27._4_4_ = local_27e0;
                      auVar27._0_4_ = local_27e0;
                      auVar27._8_4_ = local_27e0;
                      auVar27._12_4_ = local_27e0;
                      auVar27._16_4_ = local_27e0;
                      auVar27._20_4_ = local_27e0;
                      auVar27._24_4_ = local_27e0;
                      auVar27._28_4_ = local_27e0;
                      auVar87 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar27,local_2ac0);
                      auVar45 = vandps_avx(ZEXT1632(auVar46),local_28c0);
                      auVar105._8_4_ = 0x219392ef;
                      auVar105._0_8_ = 0x219392ef219392ef;
                      auVar105._12_4_ = 0x219392ef;
                      auVar105._16_4_ = 0x219392ef;
                      auVar105._20_4_ = 0x219392ef;
                      auVar105._24_4_ = 0x219392ef;
                      auVar105._28_4_ = 0x219392ef;
                      auVar45 = vcmpps_avx(auVar45,auVar105,1);
                      auVar73 = vblendvps_avx(ZEXT1632(auVar46),auVar105,auVar45);
                      auVar45 = vandps_avx(ZEXT1632(auVar67),local_28c0);
                      auVar45 = vcmpps_avx(auVar45,auVar105,1);
                      auVar83 = vblendvps_avx(ZEXT1632(auVar67),auVar105,auVar45);
                      auVar103 = ZEXT3264(auVar103._0_32_);
                      auVar21._4_4_ = local_2b20._4_4_;
                      auVar21._0_4_ = local_2b20._0_4_;
                      auVar21._8_4_ = local_2b20._8_4_;
                      auVar21._12_4_ = local_2b20._12_4_;
                      auVar21._16_4_ = local_2b20._16_4_;
                      auVar21._20_4_ = local_2b20._20_4_;
                      auVar21._24_4_ = local_2b20._24_4_;
                      auVar21._28_4_ = local_2b20._28_4_;
                      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar21,local_2bc0);
                      auVar93 = vfmadd231ps_fma(local_2860,auVar21,auVar20);
                      auVar89 = vfmadd231ps_fma(local_2880,auVar21,auVar27);
                      auVar45 = vandps_avx(ZEXT1632(auVar87),local_28c0);
                      auVar45 = vcmpps_avx(auVar45,auVar105,1);
                      auVar51 = vrcpps_avx(auVar73);
                      auVar45 = vblendvps_avx(ZEXT1632(auVar87),auVar105,auVar45);
                      auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                                    CONCAT424(0x7f800000,
                                                              CONCAT420(0x7f800000,
                                                                        CONCAT416(0x7f800000,
                                                                                  CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      auVar41 = vfnmadd213ps_fma(auVar73,auVar51,auVar95);
                      auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar51,auVar51);
                      auVar73 = vrcpps_avx(auVar83);
                      auVar46 = vfnmadd213ps_fma(auVar83,auVar73,auVar95);
                      auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar73,auVar73);
                      auVar73 = vrcpps_avx(auVar45);
                      auVar67 = vfnmadd213ps_fma(auVar45,auVar73,auVar95);
                      auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar73,auVar73);
                      auVar45 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar96));
                      auVar73 = vsubps_avx(auVar92,ZEXT1632(auVar96));
                      auVar16._4_4_ = auVar41._4_4_ * auVar45._4_4_;
                      auVar16._0_4_ = auVar41._0_4_ * auVar45._0_4_;
                      auVar16._8_4_ = auVar41._8_4_ * auVar45._8_4_;
                      auVar16._12_4_ = auVar41._12_4_ * auVar45._12_4_;
                      auVar16._16_4_ = auVar45._16_4_ * 0.0;
                      auVar16._20_4_ = auVar45._20_4_ * 0.0;
                      auVar16._24_4_ = auVar45._24_4_ * 0.0;
                      auVar16._28_4_ = auVar45._28_4_;
                      auVar44._0_4_ = auVar41._0_4_ * auVar73._0_4_;
                      auVar44._4_4_ = auVar41._4_4_ * auVar73._4_4_;
                      auVar44._8_4_ = auVar41._8_4_ * auVar73._8_4_;
                      auVar44._12_4_ = auVar41._12_4_ * auVar73._12_4_;
                      auVar44._16_4_ = auVar73._16_4_ * 0.0;
                      auVar44._20_4_ = auVar73._20_4_ * 0.0;
                      auVar44._24_4_ = auVar73._24_4_ * 0.0;
                      auVar44._28_4_ = 0;
                      auVar45 = vsubps_avx(local_2840,ZEXT1632(auVar93));
                      auVar73 = vsubps_avx(auVar97,ZEXT1632(auVar93));
                      auVar17._4_4_ = auVar46._4_4_ * auVar45._4_4_;
                      auVar17._0_4_ = auVar46._0_4_ * auVar45._0_4_;
                      auVar17._8_4_ = auVar46._8_4_ * auVar45._8_4_;
                      auVar17._12_4_ = auVar46._12_4_ * auVar45._12_4_;
                      auVar17._16_4_ = auVar45._16_4_ * 0.0;
                      auVar17._20_4_ = auVar45._20_4_ * 0.0;
                      auVar17._24_4_ = auVar45._24_4_ * 0.0;
                      auVar17._28_4_ = auVar45._28_4_;
                      auVar47._0_4_ = auVar46._0_4_ * auVar73._0_4_;
                      auVar47._4_4_ = auVar46._4_4_ * auVar73._4_4_;
                      auVar47._8_4_ = auVar46._8_4_ * auVar73._8_4_;
                      auVar47._12_4_ = auVar46._12_4_ * auVar73._12_4_;
                      auVar47._16_4_ = auVar73._16_4_ * 0.0;
                      auVar47._20_4_ = auVar73._20_4_ * 0.0;
                      auVar47._24_4_ = auVar73._24_4_ * 0.0;
                      auVar47._28_4_ = 0;
                      auVar45 = vsubps_avx(local_2800,ZEXT1632(auVar89));
                      auVar18._4_4_ = auVar67._4_4_ * auVar45._4_4_;
                      auVar18._0_4_ = auVar67._0_4_ * auVar45._0_4_;
                      auVar18._8_4_ = auVar67._8_4_ * auVar45._8_4_;
                      auVar18._12_4_ = auVar67._12_4_ * auVar45._12_4_;
                      auVar18._16_4_ = auVar45._16_4_ * 0.0;
                      auVar18._20_4_ = auVar45._20_4_ * 0.0;
                      auVar18._24_4_ = auVar45._24_4_ * 0.0;
                      auVar18._28_4_ = auVar45._28_4_;
                      auVar26._4_4_ = fStack_281c;
                      auVar26._0_4_ = local_2820;
                      auVar26._8_4_ = fStack_2818;
                      auVar26._12_4_ = fStack_2814;
                      auVar26._16_4_ = fStack_2810;
                      auVar26._20_4_ = fStack_280c;
                      auVar26._24_4_ = fStack_2808;
                      auVar26._28_4_ = fStack_2804;
                      auVar45 = vsubps_avx(auVar26,ZEXT1632(auVar89));
                      auVar19._4_4_ = auVar67._4_4_ * auVar45._4_4_;
                      auVar19._0_4_ = auVar67._0_4_ * auVar45._0_4_;
                      auVar19._8_4_ = auVar67._8_4_ * auVar45._8_4_;
                      auVar19._12_4_ = auVar67._12_4_ * auVar45._12_4_;
                      auVar19._16_4_ = auVar45._16_4_ * 0.0;
                      auVar19._20_4_ = auVar45._20_4_ * 0.0;
                      auVar19._24_4_ = auVar45._24_4_ * 0.0;
                      auVar19._28_4_ = auVar45._28_4_;
                      auVar45 = vpminsd_avx2(auVar16,auVar44);
                      auVar73 = vpminsd_avx2(auVar17,auVar47);
                      auVar45 = vpmaxsd_avx2(auVar45,auVar73);
                      auVar73 = vpminsd_avx2(auVar18,auVar19);
                      auVar83 = vpmaxsd_avx2(auVar45,auVar73);
                      auVar45 = vpmaxsd_avx2(auVar16,auVar44);
                      auVar73 = vpmaxsd_avx2(auVar17,auVar47);
                      auVar73 = vpminsd_avx2(auVar45,auVar73);
                      auVar45 = vpmaxsd_avx2(auVar18,auVar19);
                      auVar73 = vpminsd_avx2(auVar73,auVar45);
                      auVar45 = vpmaxsd_avx2(auVar83,local_2940);
                      auVar73 = vpminsd_avx2(auVar73,local_2920);
                      auVar73 = vcmpps_avx(auVar45,auVar73,2);
                      uStack_27dc = local_27e0;
                      uStack_27d8 = local_27e0;
                      uStack_27d4 = local_27e0;
                      uStack_27d0 = local_27e0;
                      uStack_27cc = local_27e0;
                      uStack_27c8 = local_27e0;
                      uStack_27c4 = local_27e0;
LAB_005be3dc:
                      auVar41 = auVar73._0_16_;
                      auVar46 = auVar73._16_16_;
                    }
                    auVar41 = vpackssdw_avx(auVar41,auVar46);
                    auVar46 = vpackssdw_avx(local_28a0._0_16_,local_28a0._16_16_);
                    auVar49 = ZEXT1664(auVar46);
                    auVar41 = vpand_avx(auVar41,auVar46);
                    auVar45 = vpmovzxwd_avx2(auVar41);
                    auVar45 = vpslld_avx2(auVar45,0x1f);
                    if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar45 >> 0x7f,0) != '\0') ||
                          (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar45 >> 0xbf,0) != '\0') ||
                        (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar45[0x1f] < '\0') {
                      auVar45 = vblendvps_avx(auVar101._0_32_,auVar83,auVar45);
                      if (root.ptr != 8) {
                        *puVar38 = root.ptr;
                        puVar38 = puVar38 + 1;
                        *pauVar39 = auVar103._0_32_;
                        pauVar39 = pauVar39 + 1;
                      }
                      auVar103 = ZEXT3264(auVar45);
                      root.ptr = uVar4;
                    }
                  }
                } while ((uVar4 != 8) && (bVar40 = uVar35 < 3, uVar35 = uVar35 + 1, bVar40));
                iVar29 = 0;
                if (root.ptr == 8) {
LAB_005be482:
                  pRVar36 = (RayQueryContext *)0x0;
                  iVar29 = 4;
                }
                else {
                  auVar45 = vcmpps_avx(local_2920,auVar103._0_32_,6);
                  uVar33 = vmovmskps_avx(auVar45);
                  pRVar36 = (RayQueryContext *)0x1;
                  if ((uint)POPCOUNT(uVar33) <= uVar32) {
                    *puVar38 = root.ptr;
                    puVar38 = puVar38 + 1;
                    *pauVar39 = auVar103._0_32_;
                    pauVar39 = pauVar39 + 1;
                    goto LAB_005be482;
                  }
                }
              } while ((char)pRVar36 != '\0');
            }
          }
        }
      } while (iVar29 != 3);
      auVar45 = vandps_avx(local_28e0,local_2b60);
      auVar48._8_4_ = 0xff800000;
      auVar48._0_8_ = 0xff800000ff800000;
      auVar48._12_4_ = 0xff800000;
      auVar48._16_4_ = 0xff800000;
      auVar48._20_4_ = 0xff800000;
      auVar48._24_4_ = 0xff800000;
      auVar48._28_4_ = 0xff800000;
      auVar45 = vmaskmovps_avx(auVar45,auVar48);
      *(undefined1 (*) [32])(ray + 0x100) = auVar45;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }